

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * tinyxml2::XMLUtil::GetCharacterRef(char *p,char *value,int *length)

{
  byte *pbVar1;
  char *pcVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  unsigned_long input;
  long lVar6;
  
  *length = 0;
  if (p[1] != '#') {
    return p + 1;
  }
  if (p[2] == '\0') {
    return p + 1;
  }
  if (p[2] == 'x') {
    if ((p[3] != '\0') && (pbVar1 = (byte *)strchr(p + 3,0x3b), pbVar1 != (byte *)0x0)) {
      lVar6 = (long)pbVar1 - (long)p;
      iVar3 = 1;
      input = 0;
      while( true ) {
        pbVar1 = pbVar1 + -1;
        bVar4 = *pbVar1;
        if (bVar4 == 0x78) break;
        if ((byte)(bVar4 - 0x30) < 10) {
          uVar5 = (uint)(byte)(bVar4 - 0x30);
        }
        else if ((byte)(bVar4 + 0x9f) < 6) {
          uVar5 = bVar4 - 0x57;
        }
        else {
          if (5 < (byte)(bVar4 + 0xbf)) {
            return (char *)0x0;
          }
          uVar5 = bVar4 - 0x37;
        }
        input = input + uVar5 * iVar3;
        iVar3 = iVar3 << 4;
      }
LAB_0017da15:
      ConvertUTF32ToUTF8(input,value,length);
      return p + lVar6 + 1;
    }
  }
  else {
    pcVar2 = strchr(p + 2,0x3b);
    if (pcVar2 != (char *)0x0) {
      lVar6 = (long)pcVar2 - (long)p;
      iVar3 = 1;
      input = 0;
      while( true ) {
        pcVar2 = pcVar2 + -1;
        if (*pcVar2 == '#') break;
        bVar4 = *pcVar2 - 0x30;
        if (9 < bVar4) {
          return (char *)0x0;
        }
        input = input + (uint)bVar4 * iVar3;
        iVar3 = iVar3 * 10;
      }
      goto LAB_0017da15;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* XMLUtil::GetCharacterRef( const char* p, char* value, int* length )
{
    // Presume an entity, and pull it out.
    *length = 0;

    if ( *(p+1) == '#' && *(p+2) ) {
        unsigned long ucs = 0;
        TIXMLASSERT( sizeof( ucs ) >= 4 );
        ptrdiff_t delta = 0;
        unsigned mult = 1;
        static const char SEMICOLON = ';';

        if ( *(p+2) == 'x' ) {
            // Hexadecimal.
            const char* q = p+3;
            if ( !(*q) ) {
                return 0;
            }

            q = strchr( q, SEMICOLON );

            if ( !q ) {
                return 0;
            }
            TIXMLASSERT( *q == SEMICOLON );

            delta = q-p;
            --q;

            while ( *q != 'x' ) {
                unsigned int digit = 0;

                if ( *q >= '0' && *q <= '9' ) {
                    digit = *q - '0';
                }
                else if ( *q >= 'a' && *q <= 'f' ) {
                    digit = *q - 'a' + 10;
                }
                else if ( *q >= 'A' && *q <= 'F' ) {
                    digit = *q - 'A' + 10;
                }
                else {
                    return 0;
                }
                TIXMLASSERT( digit < 16 );
                TIXMLASSERT( digit == 0 || mult <= UINT_MAX / digit );
                const unsigned int digitScaled = mult * digit;
                TIXMLASSERT( ucs <= ULONG_MAX - digitScaled );
                ucs += digitScaled;
                TIXMLASSERT( mult <= UINT_MAX / 16 );
                mult *= 16;
                --q;
            }
        }
        else {
            // Decimal.
            const char* q = p+2;
            if ( !(*q) ) {
                return 0;
            }

            q = strchr( q, SEMICOLON );

            if ( !q ) {
                return 0;
            }
            TIXMLASSERT( *q == SEMICOLON );

            delta = q-p;
            --q;

            while ( *q != '#' ) {
                if ( *q >= '0' && *q <= '9' ) {
                    const unsigned int digit = *q - '0';
                    TIXMLASSERT( digit < 10 );
                    TIXMLASSERT( digit == 0 || mult <= UINT_MAX / digit );
                    const unsigned int digitScaled = mult * digit;
                    TIXMLASSERT( ucs <= ULONG_MAX - digitScaled );
                    ucs += digitScaled;
                }
                else {
                    return 0;
                }
                TIXMLASSERT( mult <= UINT_MAX / 10 );
                mult *= 10;
                --q;
            }
        }
        // convert the UCS to UTF-8
        ConvertUTF32ToUTF8( ucs, value, length );
        return p + delta + 1;
    }
    return p+1;
}